

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void do_change_class_name_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_String *pAVar2;
  Am_Value_List *pAVar3;
  Am_Object_Method_Type *pAVar4;
  char cVar5;
  Am_Object *this;
  Am_String new_name;
  Am_String old_name;
  Am_Object cls;
  Am_String local_50;
  Am_String local_48;
  Am_String local_40;
  Am_String local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value_List local_20 [16];
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x16c);
  Am_String::Am_String(&old_name,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_String::Am_String(&new_name,pAVar1);
  cVar5 = Am_String::operator==(&old_name,"");
  if (cVar5 == '\0') {
LAB_00107ec4:
    cVar5 = Am_String::operator==(&old_name,&new_name);
    if (cVar5 != '\0') goto LAB_00108085;
    cVar5 = Am_String::operator==(&new_name,"");
    if (cVar5 == '\0') {
      Am_String::Am_String(&local_38,&old_name);
      Am_String::Am_String(&local_40,&new_name);
      cVar5 = Am_Gesture_Trainer::Rename_Class
                        ((Am_String)0x110570,(Am_String_Data *)&local_38,SUB81(&local_40,0));
      Am_String::~Am_String(&local_40);
      Am_String::~Am_String(&local_38);
      if (cVar5 == '\0') goto LAB_00107f89;
      pAVar1 = (Am_Value *)Am_Object::Get(0x500,0x169);
      Am_Object::Am_Object(&cls,pAVar1);
      Am_Object::Set((ushort)&cls,(Am_String *)(ulong)(ushort)CLASS_NAME,(ulong)&new_name);
      dirty = true;
    }
    else {
LAB_00107f89:
      Am_Value_List::Am_Value_List((Am_Value_List *)&cls);
      Am_String::Am_String(&local_48,"A class named",true);
      pAVar2 = (Am_String *)Am_Value_List::Add((Am_String *)&cls,(Am_Add_Position)&local_48,true);
      pAVar2 = (Am_String *)Am_Value_List::Add(pAVar2,(Am_Add_Position)&new_name,true);
      Am_String::Am_String(&local_50,"already exists.",true);
      pAVar3 = (Am_Value_List *)Am_Value_List::Add(pAVar2,(Am_Add_Position)&local_50,true);
      Am_Value_List::Am_Value_List(local_20,pAVar3);
      Popup_Error(local_20);
      Am_Value_List::~Am_Value_List(local_20);
      Am_String::~Am_String(&local_50);
      Am_String::~Am_String(&local_48);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&cls);
      Am_Object::Set(0x508,(Am_String *)0x169,(ulong)&old_name);
      Am_Object::Get_Object((ushort)&cls,0x110508);
      Am_Object::Set((ushort)&cls,(Am_String *)0x169,(ulong)&old_name);
    }
    this = &cls;
  }
  else {
    cVar5 = Am_String::operator==(&new_name,"");
    if (cVar5 == '\0') goto LAB_00107ec4;
    Am_Object::Am_Object(&local_28,(Am_Object *)&Am_No_Object);
    Am_Beep((Am_Object_Data *)&local_28);
    Am_Object::~Am_Object(&local_28);
    pAVar4 = do_delete_class.Call;
    Am_Object::Am_Object(&local_30,cmd);
    (*pAVar4)((Am_Object_Data *)&local_30);
    this = &local_30;
  }
  Am_Object::~Am_Object(this);
LAB_00108085:
  Am_String::~Am_String(&new_name);
  Am_String::~Am_String(&old_name);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_change_class_name, (Am_Object cmd))
{
  Am_String old_name = cmd.Get(Am_OLD_VALUE);
  Am_String new_name = cmd.Get(Am_VALUE);

  //  cout << "Renaming class " << old_name << " to " << new_name << endl;

  if (old_name == NEW_CLASS_NAME && new_name == NEW_CLASS_NAME) {
    // user was entering name for a new class, but didn't change it.
    // Delete the new class
    extern Am_Object_Method do_delete_class;
    Am_Beep();
    do_delete_class.Call(cmd);
    return;
  }

  if (old_name == new_name)
    return;

  // change name in trainer

  if (new_name == ""                               // can't erase name
      || !trainer.Rename_Class(old_name, new_name) // or duplicate another
      ) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String("A class named"))
                    .Add(new_name)
                    .Add(Am_String("already exists.")));

    // undo edit to current_class_name widget
    current_class_name.Set(Am_VALUE, old_name);
    current_class_name.Get_Object(Am_COMMAND).Set(Am_VALUE, old_name);
    return;
  }

  // now update Class object

  Am_Object cls = class_panel.Get(Am_VALUE);
  cls.Set(CLASS_NAME, new_name);

  // the classifier has changed, so set dirty flag
  dirty = true;
}